

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O2

void __thiscall test_suite::detail::simple_runner::note(simple_runner *this,char *msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->log_,msg);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void
  note(char const* msg) override
  {
    log_ << msg << "\n";
  }